

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * cJSON_PrintBuffered(cJSON *item,int prebuffer,int fmt)

{
  char *pcVar1;
  printbuffer p;
  printbuffer local_28;
  
  local_28.buffer = (char *)(*cJSON_malloc)((long)prebuffer);
  local_28.offset = 0;
  local_28.length = prebuffer;
  pcVar1 = print_value(item,0,fmt,&local_28);
  return pcVar1;
}

Assistant:

char *cJSON_PrintBuffered(cJSON *item,int prebuffer,int fmt)
{
	printbuffer p;
	p.buffer=(char*)cJSON_malloc(prebuffer);
	p.length=prebuffer;
	p.offset=0;
	return print_value(item,0,fmt,&p);
	return p.buffer;
}